

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_q4_0(block_q4_0 *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  int j;
  long lVar7;
  
  uVar4 = 0;
  uVar3 = k / 0x20 & 0xffffffff;
  if ((int)(k / 0x20) < 1) {
    uVar3 = uVar4;
  }
  puVar5 = x->qs;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    uVar6 = (ulong)((uint)uVar4 & 0x7ffffff);
    fVar1 = ggml_table_f32_f16[x[uVar4].d];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      bVar2 = puVar5[lVar7];
      y[uVar6 * 0x20 + lVar7] = (float)(int)((bVar2 & 0xf) - 8) * fVar1;
      y[uVar6 * 0x20 + lVar7 + 0x10] = (float)(int)((bVar2 >> 4) - 8) * fVar1;
    }
    puVar5 = puVar5 + 0x12;
  }
  return;
}

Assistant:

void dequantize_row_q4_0(const block_q4_0 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    static const int qk = QK4_0;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int j = 0; j < qk/2; ++j) {
            const int x0 = (x[i].qs[j] & 0x0F) - 8;
            const int x1 = (x[i].qs[j] >>   4) - 8;

            y[i*qk + j + 0   ] = x0*d;
            y[i*qk + j + qk/2] = x1*d;
        }
    }
}